

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSingularFieldHasBits
          (MessageGenerator *this,FieldDescriptor *field,Formatter *format)

{
  bool bVar1;
  CppType CVar2;
  FieldOptions *this_00;
  LogMessage *other;
  Hex local_d8;
  allocator local_c1;
  string local_c0;
  int local_a0;
  allocator local_99;
  string local_98;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  int local_24;
  Formatter *pFStack_20;
  int has_bit_index;
  Formatter *format_local;
  FieldDescriptor *field_local;
  MessageGenerator *this_local;
  
  pFStack_20 = format;
  format_local = (Formatter *)field;
  field_local = (FieldDescriptor *)this;
  bVar1 = IsFieldStripped(field,&this->options_);
  if (bVar1) {
    Formatter::operator()<>
              (format,"inline bool $classname$::has_$name$() const { __builtin_trap(); }\n");
  }
  else {
    this_00 = FieldDescriptor::options((FieldDescriptor *)format_local);
    bVar1 = FieldOptions::weak(this_00);
    if (bVar1) {
      Formatter::operator()<>
                (format,
                 "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _weak_field_map_.Has($number$);\n}\n"
                );
    }
    else {
      bVar1 = HasHasbit((FieldDescriptor *)format_local);
      if (bVar1) {
        local_24 = HasBitIndex(this,(FieldDescriptor *)format_local);
        local_61 = 0;
        if (local_24 == -1) {
          internal::LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x468);
          local_61 = 1;
          other = internal::LogMessage::operator<<
                            (&local_60,"CHECK failed: (has_bit_index) != (kNoHasbit): ");
          internal::LogFinisher::operator=(local_75,other);
        }
        if ((local_61 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_60);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_98,"has_array_index",&local_99);
        local_a0 = local_24;
        if (local_24 < 0) {
          local_a0 = local_24 + 0x1f;
        }
        local_a0 = local_a0 >> 5;
        Formatter::Set<int>(format,&local_98,&local_a0);
        std::__cxx11::string::~string((string *)&local_98);
        std::allocator<char>::~allocator((allocator<char> *)&local_99);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_c0,"has_mask",&local_c1);
        strings::Hex::Hex<unsigned_int>(&local_d8,1 << ((byte)local_24 & 0x1f),ZERO_PAD_8);
        Formatter::Set<google::protobuf::strings::Hex>(format,&local_c0,&local_d8);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&local_c1);
        Formatter::operator()<>
                  (format,
                   "inline bool $classname$::_internal_has_$name$() const {\n  bool value = (_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n"
                  );
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)format_local);
        if ((CVar2 == CPPTYPE_MESSAGE) &&
           (bVar1 = IsLazy((FieldDescriptor *)format_local,&this->options_,this->scc_analyzer_),
           !bVar1)) {
          Formatter::operator()<>(format,"  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
        }
        Formatter::operator()<>
                  (format,
                   "  return value;\n}\ninline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
                  );
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)format_local);
        if (CVar2 == CPPTYPE_MESSAGE) {
          bVar1 = IsLazy((FieldDescriptor *)format_local,&this->options_,this->scc_analyzer_);
          if (bVar1) {
            Formatter::operator()<>
                      (format,
                       "inline bool $classname$::_internal_has_$name$() const {\n  return !$name$_.IsCleared();\n}\n"
                      );
          }
          else {
            Formatter::operator()<>
                      (format,
                       "inline bool $classname$::_internal_has_$name$() const {\n  return this != internal_default_instance() && $name$_ != nullptr;\n}\n"
                      );
          }
          Formatter::operator()<>
                    (format,
                     "inline bool $classname$::has_$name$() const {\n$annotate_has$  return _internal_has_$name$();\n}\n"
                    );
        }
      }
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateSingularFieldHasBits(
    const FieldDescriptor* field, Formatter format) {
  if (IsFieldStripped(field, options_)) {
    format(
        "inline bool $classname$::has_$name$() const { "
        "__builtin_trap(); }\n");
    return;
  }
  if (field->options().weak()) {
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _weak_field_map_.Has($number$);\n"
        "}\n");
    return;
  }
  if (HasHasbit(field)) {
    int has_bit_index = HasBitIndex(field);
    GOOGLE_CHECK_NE(has_bit_index, kNoHasbit);

    format.Set("has_array_index", has_bit_index / 32);
    format.Set("has_mask",
               strings::Hex(1u << (has_bit_index % 32), strings::ZERO_PAD_8));
    format(
        "inline bool $classname$::_internal_has_$name$() const {\n"
        "  bool value = "
        "(_has_bits_[$has_array_index$] & 0x$has_mask$u) != 0;\n");

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsLazy(field, options_, scc_analyzer_)) {
      // We maintain the invariant that for a submessage x, has_x() returning
      // true implies that x_ is not null. By giving this information to the
      // compiler, we allow it to eliminate unnecessary null checks later on.
      format("  PROTOBUF_ASSUME(!value || $name$_ != nullptr);\n");
    }

    format(
        "  return value;\n"
        "}\n"
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message fields have a has_$name$() method.
    if (IsLazy(field, options_, scc_analyzer_)) {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return !$name$_.IsCleared();\n"
          "}\n");
    } else {
      format(
          "inline bool $classname$::_internal_has_$name$() const {\n"
          "  return this != internal_default_instance() "
          "&& $name$_ != nullptr;\n"
          "}\n");
    }
    format(
        "inline bool $classname$::has_$name$() const {\n"
        "$annotate_has$"
        "  return _internal_has_$name$();\n"
        "}\n");
  }
}